

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int server_handle_finished(ptls_t *tls,ptls_iovec_t message)

{
  int ret;
  ptls_t *tls_local;
  ptls_iovec_t message_local;
  
  message_local.len._4_4_ = verify_finished(tls,message);
  if (message_local.len._4_4_ == 0) {
    memcpy(&tls->traffic_protection,&tls->field_20,0x40);
    (*ptls_clear_memory)(&tls->field_20,0x40);
    message_local.len._4_4_ = setup_traffic_protection(tls,0,(char *)0x0,3,0);
    if (message_local.len._4_4_ == 0) {
      ptls__key_schedule_update_hash(tls->key_schedule,message.base,message.len);
      tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
      message_local.len._4_4_ = 0;
    }
  }
  return message_local.len._4_4_;
}

Assistant:

static int server_handle_finished(ptls_t *tls, ptls_iovec_t message)
{
    int ret;

    if ((ret = verify_finished(tls, message)) != 0)
        return ret;

    memcpy(tls->traffic_protection.dec.secret, tls->server.pending_traffic_secret, sizeof(tls->server.pending_traffic_secret));
    ptls_clear_memory(tls->server.pending_traffic_secret, sizeof(tls->server.pending_traffic_secret));
    if ((ret = setup_traffic_protection(tls, 0, NULL, 3, 0)) != 0)
        return ret;

    ptls__key_schedule_update_hash(tls->key_schedule, message.base, message.len);

    tls->state = PTLS_STATE_SERVER_POST_HANDSHAKE;
    return 0;
}